

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O1

void __thiscall
OpenMPDeviceTypeClause::generateDOT
          (OpenMPDeviceTypeClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_t sVar8;
  uint uVar9;
  long *plVar10;
  ulong *puVar11;
  size_type *psVar12;
  ulong uVar13;
  uint uVar14;
  undefined8 uVar15;
  uint uVar16;
  string __str_1;
  string node_id;
  string parameter_string;
  string __str;
  string clause_kind;
  string indent;
  string current_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char *local_b8;
  undefined8 local_b0;
  char local_a8;
  undefined7 uStack_a7;
  long *local_98 [2];
  long local_88 [2];
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  OpenMPDeviceTypeClause *local_38;
  
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_38 = this;
  std::__cxx11::string::_M_construct((ulong)&local_d8,(char)depth);
  uVar14 = -depth;
  if (0 < depth) {
    uVar14 = depth;
  }
  uVar16 = 1;
  if (9 < uVar14) {
    uVar13 = (ulong)uVar14;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_0014e676;
      }
      if (uVar9 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_0014e676;
      }
      if (uVar9 < 10000) goto LAB_0014e676;
      uVar13 = uVar13 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar9);
    uVar16 = uVar16 + 1;
  }
LAB_0014e676:
  local_158 = &local_148;
  std::__cxx11::string::_M_construct((ulong)&local_158,(char)uVar16 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_158),uVar16,uVar14);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x1a7f3b);
  local_198 = &local_188;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_188 = *plVar10;
    lStack_180 = plVar6[3];
  }
  else {
    local_188 = *plVar10;
    local_198 = (long *)*plVar6;
  }
  local_190 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
  local_178 = &local_168;
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_168 = *puVar11;
    lStack_160 = plVar6[3];
  }
  else {
    local_168 = *puVar11;
    local_178 = (ulong *)*plVar6;
  }
  local_170 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar14 = -index;
  if (0 < index) {
    uVar14 = index;
  }
  uVar16 = 1;
  if (9 < uVar14) {
    uVar13 = (ulong)uVar14;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_0014e7bc;
      }
      if (uVar9 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_0014e7bc;
      }
      if (uVar9 < 10000) goto LAB_0014e7bc;
      uVar13 = uVar13 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar9);
    uVar16 = uVar16 + 1;
  }
LAB_0014e7bc:
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar16 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1b8._M_dataplus._M_p + ((uint)index >> 0x1f),uVar16,uVar14);
  uVar13 = 0xf;
  if (local_178 != &local_168) {
    uVar13 = local_168;
  }
  if (uVar13 < local_1b8._M_string_length + local_170) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      uVar15 = local_1b8.field_2._M_allocated_capacity;
    }
    if (local_1b8._M_string_length + local_170 <= (ulong)uVar15) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_178);
      goto LAB_0014e852;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_1b8._M_dataplus._M_p);
LAB_0014e852:
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar12 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_138.field_2._M_allocated_capacity = *psVar12;
    local_138.field_2._8_8_ = puVar7[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar12;
    local_138._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_138._M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)psVar12 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  std::operator+(&local_1b8,&local_d8,parent_node);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_148 = *plVar10;
    lStack_140 = plVar6[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *plVar10;
    local_158 = (long *)*plVar6;
  }
  local_150 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_158,(ulong)local_138._M_dataplus._M_p);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_188 = *plVar10;
    lStack_180 = plVar6[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar10;
    local_198 = (long *)*plVar6;
  }
  local_190 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_168 = *puVar11;
    lStack_160 = plVar6[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar11;
    local_178 = (ulong *)*plVar6;
  }
  local_170 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_178);
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = local_b8;
  iVar3 = (int)dot_file;
  if (local_b8 == (char *)0x0) {
    std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
  }
  else {
    sVar8 = strlen(local_b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar4,sVar8);
  }
  std::__cxx11::string::append((char *)&local_d8);
  local_170 = 0;
  local_168 = local_168 & 0xffffffffffffff00;
  local_178 = &local_168;
  if ((ulong)local_38->device_type_kind < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_178,0,(char *)0x0,
               (ulong)(&DAT_001a7d60 +
                      *(int *)(&DAT_001a7d60 + (ulong)local_38->device_type_kind * 4)));
  }
  if (local_170 != 0) {
    local_198 = &local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_138._M_dataplus._M_p,
               local_138._M_dataplus._M_p + local_138._M_string_length);
    std::__cxx11::string::append((char *)&local_198);
    std::operator+(&local_f8,&local_d8,&local_138);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_108 = *plVar10;
      lStack_100 = plVar6[3];
      local_118 = &local_108;
    }
    else {
      local_108 = *plVar10;
      local_118 = (long *)*plVar6;
    }
    local_110 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_198);
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1b8.field_2._M_allocated_capacity = *psVar12;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *psVar12;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_148 = *plVar10;
      lStack_140 = plVar6[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar10;
      local_158 = (long *)*plVar6;
    }
    local_150 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_158);
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    paVar2 = &local_f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = local_b8;
    if (local_b8 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar8 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar4,sVar8);
    }
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    std::__cxx11::string::append((char *)local_98);
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_98,(ulong)local_198);
    local_78 = &local_68;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_68 = *plVar10;
      lStack_60 = plVar6[3];
    }
    else {
      local_68 = *plVar10;
      local_78 = (long *)*plVar6;
    }
    local_70 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_58 = &local_48;
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_48 = *plVar10;
      lStack_40 = plVar6[3];
    }
    else {
      local_48 = *plVar10;
      local_58 = (long *)*plVar6;
    }
    local_50 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_198);
    psVar12 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f8.field_2._M_allocated_capacity = *psVar12;
      local_f8.field_2._8_8_ = plVar6[3];
      local_f8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar12;
      local_f8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_f8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_108 = *plVar10;
      lStack_100 = plVar6[3];
      local_118 = &local_108;
    }
    else {
      local_108 = *plVar10;
      local_118 = (long *)*plVar6;
    }
    local_110 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_178);
    puVar11 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_1b8.field_2._M_allocated_capacity = *puVar11;
      local_1b8.field_2._8_8_ = plVar6[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar11;
      local_1b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_1b8._M_string_length = plVar6[1];
    *plVar6 = (long)puVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    plVar10 = plVar6 + 2;
    if ((long *)*plVar6 == plVar10) {
      local_148 = *plVar10;
      lStack_140 = plVar6[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *plVar10;
      local_158 = (long *)*plVar6;
    }
    local_150 = plVar6[1];
    *plVar6 = (long)plVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_158);
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,local_108 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    pcVar4 = local_b8;
    if (local_b8 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar8 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar4,sVar8);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  return;
}

Assistant:

void OpenMPDeviceTypeClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "device_type_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDeviceTypeClauseKind device_type_kind = this->getDeviceTypeClauseKind();
    std::string parameter_string;
    switch (device_type_kind) {
        case OMPC_DEVICE_TYPE_host:
            parameter_string = "host";
            break;
        case OMPC_DEVICE_TYPE_nohost:
            parameter_string = "nohost";
            break;
        case OMPC_DEVICE_TYPE_any:
            parameter_string = "any";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
}